

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *
Kernel::operator*(Numeral *n,Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *self)

{
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_RSI;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_RDI;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:609:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  *in_stack_ffffffffffffff98;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *in_stack_ffffffffffffffb8;
  anon_class_8_1_54a3980e_for__func in_stack_ffffffffffffffc0;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_stack_ffffffffffffffd8;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffffe0;
  
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::iterSummands
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)in_RSI);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&>>
  ::operator*(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Polynomial.hpp:609:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ::collect<Lib::Stack>(in_stack_ffffffffffffff98);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(in_RSI);
  return in_RDI;
}

Assistant:

Polynom operator*(Numeral n, Polynom const& self) 
  { return Polynom(self.iterSummands()
      .map([&](auto m) { return n * m; })
      .template collect<Stack>()); }